

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

RPCHelpMan * wallet::getwalletinfo(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  RPCHelpMan *in_RDI;
  undefined8 uVar10;
  long lVar11;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_ffffffffffffe868;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffe86c;
  undefined8 in_stack_ffffffffffffe878;
  undefined8 in_stack_ffffffffffffe880;
  undefined8 in_stack_ffffffffffffe888;
  code *pcVar13;
  undefined8 in_stack_ffffffffffffe890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffe898;
  pointer in_stack_ffffffffffffe8a8;
  pointer pRVar14;
  pointer in_stack_ffffffffffffe8b0;
  pointer pRVar15;
  pointer in_stack_ffffffffffffe8b8;
  pointer pRVar16;
  undefined8 in_stack_ffffffffffffe8c0;
  pointer pRVar17;
  pointer pRVar18;
  pointer pRVar19;
  undefined8 in_stack_ffffffffffffe8e0;
  pointer pRVar20;
  pointer pRVar21;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16f8;
  allocator_type local_16d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16a0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1688;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1668;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1648;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1628;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1608;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1588;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1568;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1548;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1528;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1508;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14a8;
  RPCResults local_1490;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1478;
  string local_1458;
  string local_1438;
  string local_1418;
  string local_13f8;
  string local_13d8;
  string local_13b8;
  ulong *local_1398;
  undefined8 local_1390;
  ulong local_1388;
  undefined8 uStack_1380;
  ulong *local_1378;
  size_type local_1370;
  ulong local_1368;
  undefined8 uStack_1360;
  long *local_1358 [2];
  long local_1348 [2];
  long *local_1338 [2];
  long local_1328 [2];
  long *local_1318 [2];
  long local_1308 [2];
  long *local_12f8 [2];
  long local_12e8 [2];
  long *local_12d8 [2];
  long local_12c8 [2];
  long *local_12b8 [2];
  long local_12a8 [2];
  long *local_1298 [2];
  long local_1288 [2];
  long *local_1278 [2];
  long local_1268 [2];
  long *local_1258 [2];
  long local_1248 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1238;
  long *local_1218 [2];
  long local_1208 [2];
  pointer local_11f8 [2];
  undefined1 local_11e8 [152];
  RPCResult local_1150;
  long *local_10c8 [2];
  long local_10b8 [2];
  long *local_10a8 [2];
  long local_1098 [2];
  long *local_1088 [2];
  long local_1078 [2];
  long *local_1068 [2];
  long local_1058 [2];
  long *local_1048 [2];
  long local_1038 [2];
  long *local_1028 [2];
  long local_1018 [2];
  long *local_1008 [2];
  long local_ff8 [2];
  long *local_fe8 [2];
  long local_fd8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  size_type *local_fa8;
  size_type local_fa0;
  size_type local_f98;
  undefined8 uStack_f90;
  long *local_f88 [2];
  long local_f78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f68;
  size_type *local_f48;
  size_type local_f40;
  size_type local_f38;
  undefined8 uStack_f30;
  long *local_f28 [2];
  long local_f18 [2];
  long *local_f08 [2];
  long local_ef8 [2];
  long *local_ee8 [2];
  long local_ed8 [2];
  long *local_ec8 [2];
  long local_eb8 [2];
  long *local_ea8 [2];
  long local_e98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  size_type *local_e68;
  size_type local_e60;
  size_type local_e58;
  undefined8 uStack_e50;
  long *local_e48 [2];
  long local_e38 [2];
  long *local_e28 [2];
  long local_e18 [2];
  long *local_e08 [2];
  long local_df8 [2];
  long *local_de8 [2];
  long local_dd8 [2];
  long *local_dc8 [2];
  long local_db8 [2];
  long *local_da8 [2];
  long local_d98 [2];
  long *local_d88 [2];
  long local_d78 [2];
  long *local_d68 [2];
  long local_d58 [2];
  long *local_d48 [2];
  long local_d38 [2];
  long *local_d28 [2];
  long local_d18 [2];
  long *local_d08 [2];
  long local_cf8 [2];
  long *local_ce8 [2];
  long local_cd8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_cc8;
  long *local_ca8 [2];
  long local_c98 [2];
  pointer local_c88 [2];
  undefined1 local_c78 [152];
  RPCResult local_be0;
  RPCResult local_b58;
  RPCResult local_ad0;
  RPCResult local_a48;
  RPCResult local_9c0;
  RPCResult local_938;
  RPCResult local_8b0;
  RPCResult local_828;
  RPCResult local_7a0;
  RPCResult local_718;
  RPCResult local_690;
  RPCResult local_608;
  RPCResult local_580;
  RPCResult local_4f8;
  RPCResult local_470;
  RPCResult local_3e8;
  RPCResult local_360;
  RPCResult local_2d8;
  RPCResult local_250;
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1038[1] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getwalletinfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Returns an object containing various wallet state info.\n","");
  local_120[0] = local_110;
  local_1478.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1478.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1478.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_c88[0] = (pointer)local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"walletname","");
  local_ca8[0] = local_c98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,"the wallet name","");
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe868;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe880;
  description._M_string_length = in_stack_ffffffffffffe890;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description.field_2 = in_stack_ffffffffffffe898;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffe8b0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffe8a8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_c78 + 0x10),STR,m_key_name,description,inner,SUB81(local_c88,0));
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"walletversion","");
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,"the wallet version","");
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe868;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_00._M_string_length = in_stack_ffffffffffffe890;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_00.field_2 = in_stack_ffffffffffffe898;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_be0,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_cc8,0));
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,"format","");
  local_d28[0] = local_d18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d28,"the database format (bdb or sqlite)","");
  local_1508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe868;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_01._M_string_length = in_stack_ffffffffffffe890;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_01.field_2 = in_stack_ffffffffffffe898;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_b58,STR,m_key_name_01,description_01,inner_01,SUB81(local_d08,0));
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d48,"balance","");
  local_d68[0] = local_d58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d68,"DEPRECATED. Identical to getbalances().mine.trusted","");
  local_1528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe868;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_02._M_string_length = in_stack_ffffffffffffe890;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_02.field_2 = in_stack_ffffffffffffe898;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_ad0,STR_AMOUNT,m_key_name_02,description_02,inner_02,SUB81(local_d48,0));
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"unconfirmed_balance","");
  local_da8[0] = local_d98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da8,"DEPRECATED. Identical to getbalances().mine.untrusted_pending","")
  ;
  local_1548.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1548.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1548.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe868;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_03._M_string_length = in_stack_ffffffffffffe890;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_03.field_2 = in_stack_ffffffffffffe898;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_a48,STR_AMOUNT,m_key_name_03,description_03,inner_03,SUB81(local_d88,0));
  local_dc8[0] = local_db8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_dc8,"immature_balance","");
  local_de8[0] = local_dd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_de8,"DEPRECATED. Identical to getbalances().mine.immature","");
  local_1568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe868;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_04._M_string_length = in_stack_ffffffffffffe890;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_04.field_2 = in_stack_ffffffffffffe898;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_9c0,STR_AMOUNT,m_key_name_04,description_04,inner_04,SUB81(local_dc8,0));
  local_e08[0] = local_df8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"txcount","");
  local_e28[0] = local_e18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e28,"the total number of transactions in the wallet","");
  local_1588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe868;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_05._M_string_length = in_stack_ffffffffffffe890;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_05.field_2 = in_stack_ffffffffffffe898;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_938,NUM,m_key_name_05,description_05,inner_05,SUB81(local_e08,0));
  local_e48[0] = local_e38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e48,"keypoololdest","");
  std::operator+(&local_e88,"the ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_e88,
                      " of the oldest pre-generated key in the key pool. Legacy wallets only.");
  local_e68 = &local_e58;
  psVar1 = (size_type *)(pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar9) {
    local_e58 = paVar9->_M_allocated_capacity;
    uStack_e50 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_e58 = paVar9->_M_allocated_capacity;
    local_e68 = psVar1;
  }
  local_e60 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar12 = 0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_ffffffffffffe86c;
  auVar3._12_8_ = in_stack_ffffffffffffe878;
  auVar3._20_8_ = in_stack_ffffffffffffe880;
  auVar3._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe890;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_06.field_2 = in_stack_ffffffffffffe898;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_8b0,NUM_TIME,(string)(auVar3 << 0x20),SUB81(local_e48,0),description_06,inner_06
             ,true);
  local_ea8[0] = local_e98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ea8,"keypoolsize","");
  local_ec8[0] = local_eb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ec8,"how many new keys are pre-generated (only counts external keys)",
             "");
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_07._M_string_length = in_stack_ffffffffffffe890;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_07.field_2 = in_stack_ffffffffffffe898;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_828,NUM,m_key_name_06,description_07,inner_07,SUB81(local_ea8,0));
  local_ee8[0] = local_ed8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ee8,"keypoolsize_hd_internal","");
  local_f08[0] = local_ef8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f08,
             "how many new keys are pre-generated for internal use (used for change outputs, only appears if the wallet is using this feature, otherwise external keys are used)"
             ,"");
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_ffffffffffffe86c;
  auVar4._12_8_ = in_stack_ffffffffffffe878;
  auVar4._20_8_ = in_stack_ffffffffffffe880;
  auVar4._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe890;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_08.field_2 = in_stack_ffffffffffffe898;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_7a0,NUM,(string)(auVar4 << 0x20),SUB81(local_ee8,0),description_08,inner_08,true
            );
  local_f28[0] = local_f18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f28,"unlocked_until","");
  std::operator+(&local_f68,"the ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f68,
                      " until which the wallet is unlocked for transfers, or 0 if the wallet is locked (only present for passphrase-encrypted wallets)"
                     );
  local_f48 = &local_f38;
  psVar1 = (size_type *)(pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar9) {
    local_f38 = paVar9->_M_allocated_capacity;
    uStack_f30 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f38 = paVar9->_M_allocated_capacity;
    local_f48 = psVar1;
  }
  local_f40 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1608.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1608.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1608.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar12 = 0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_ffffffffffffe86c;
  auVar5._12_8_ = in_stack_ffffffffffffe878;
  auVar5._20_8_ = in_stack_ffffffffffffe880;
  auVar5._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffe890;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_09.field_2 = in_stack_ffffffffffffe898;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_718,NUM_TIME,(string)(auVar5 << 0x20),SUB81(local_f28,0),description_09,inner_09
             ,true);
  local_f88[0] = local_f78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f88,"paytxfee","");
  std::operator+(&local_fc8,"the transaction fee configuration, set in ",&::CURRENCY_UNIT_abi_cxx11_
                );
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_fc8,"/kvB");
  local_fa8 = &local_f98;
  psVar1 = (size_type *)(pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar9) {
    local_f98 = paVar9->_M_allocated_capacity;
    uStack_f90 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f98 = paVar9->_M_allocated_capacity;
    local_fa8 = psVar1;
  }
  local_fa0 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_10._M_string_length = in_stack_ffffffffffffe890;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_10.field_2 = in_stack_ffffffffffffe898;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_690,STR_AMOUNT,m_key_name_07,description_10,inner_10,SUB81(local_f88,0));
  local_fe8[0] = local_fd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe8,"hdseedid","");
  local_1008[0] = local_ff8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1008,"the Hash160 of the HD seed (only present when HD is enabled)","")
  ;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar12 = 0;
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = in_stack_ffffffffffffe86c;
  auVar6._12_8_ = in_stack_ffffffffffffe878;
  auVar6._20_8_ = in_stack_ffffffffffffe880;
  auVar6._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffe890;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_11.field_2 = in_stack_ffffffffffffe898;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            (&local_608,STR_HEX,(string)(auVar6 << 0x20),SUB81(local_fe8,0),description_11,inner_11,
             true);
  local_1028[0] = local_1018;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1028,"private_keys_enabled","");
  local_1048[0] = local_1038;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1048,
             "false if privatekeys are disabled for this wallet (enforced watch-only wallet)","");
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_12._M_string_length = in_stack_ffffffffffffe890;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_12.field_2 = in_stack_ffffffffffffe898;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_580,BOOL,m_key_name_08,description_12,inner_12,SUB81(local_1028,0));
  local_1068[0] = local_1058;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1068,"avoid_reuse","");
  local_1088[0] = local_1078;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1088,"whether this wallet tracks clean/dirty coins in terms of reuse",
             "");
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_13._M_string_length = in_stack_ffffffffffffe890;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_13.field_2 = in_stack_ffffffffffffe898;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_4f8,BOOL,m_key_name_09,description_13,inner_13,SUB81(local_1068,0));
  local_10a8[0] = local_1098;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10a8,"scanning","");
  local_10c8[0] = local_10b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c8,"current scanning details, or false if no scan is in progress","")
  ;
  local_11f8[0] = (pointer)local_11e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11f8,"duration","");
  local_1218[0] = local_1208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1218,"elapsed seconds since scan start","");
  local_16b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_10._M_string_length = (size_type)in_RDI;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_14._M_string_length = in_stack_ffffffffffffe890;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_14.field_2 = in_stack_ffffffffffffe898;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_11e8 + 0x10),NUM,m_key_name_10,description_14,inner_14,
             SUB81(local_11f8,0));
  local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1238,"progress","");
  local_1258[0] = local_1248;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1258,"scanning progress percentage [0.0, 1.0]","");
  local_16d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_11._M_string_length = (size_type)in_RDI;
  m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_15._M_string_length = in_stack_ffffffffffffe890;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_15.field_2 = in_stack_ffffffffffffe898;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_1150,NUM,m_key_name_11,description_15,inner_15,SUB81(&local_1238,0))
  ;
  __l._M_len = 2;
  __l._M_array = (iterator)(local_11e8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_16a0,__l,&local_16d9);
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_12._M_string_length = (size_type)in_RDI;
  m_key_name_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_16._M_string_length = in_stack_ffffffffffffe890;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_16.field_2 = in_stack_ffffffffffffe898;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_470,OBJ,m_key_name_12,description_16,inner_16,SUB81(local_10a8,0));
  local_1278[0] = local_1268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1278,"descriptors","");
  local_1298[0] = local_1288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1298,
             "whether this wallet uses descriptors for output script management","");
  local_16f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_13._M_string_length = (size_type)in_RDI;
  m_key_name_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_17._M_string_length = in_stack_ffffffffffffe890;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_17.field_2 = in_stack_ffffffffffffe898;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_3e8,BOOL,m_key_name_13,description_17,inner_17,SUB81(local_1278,0));
  local_12b8[0] = local_12a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12b8,"external_signer","");
  local_12d8[0] = local_12c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12d8,
             "whether this wallet is configured to use an external signer such as a hardware wallet"
             ,"");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_14._M_string_length = (size_type)in_RDI;
  m_key_name_14.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_18._M_string_length = in_stack_ffffffffffffe890;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_18.field_2 = in_stack_ffffffffffffe898;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_360,BOOL,m_key_name_14,description_18,inner_18,SUB81(local_12b8,0));
  local_12f8[0] = local_12e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12f8,"blank","");
  local_1318[0] = local_1308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1318,
             "Whether this wallet intentionally does not contain any keys, scripts, or descriptors",
             "");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_15._M_string_length = (size_type)in_RDI;
  m_key_name_15.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_19._M_string_length = in_stack_ffffffffffffe890;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_19.field_2 = in_stack_ffffffffffffe898;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe8a8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  ::RPCResult::RPCResult(&local_2d8,BOOL,m_key_name_15,description_19,inner_19,SUB81(local_12f8,0));
  local_1338[0] = local_1328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1338,"birthtime","");
  local_1358[0] = local_1348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1358,
             "The start time for blocks scanning. It could be modified by (re)importing any descriptor with an earlier timestamp."
             ,"");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  uVar12 = 0;
  auVar7._4_8_ = in_RDI;
  auVar7._0_4_ = in_stack_ffffffffffffe86c;
  auVar7._12_8_ = in_stack_ffffffffffffe878;
  auVar7._20_8_ = in_stack_ffffffffffffe880;
  auVar7._28_4_ = 0;
  description_20._M_string_length = in_stack_ffffffffffffe890;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_20.field_2._M_local_buf = in_stack_ffffffffffffe898._M_local_buf;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult
            (&local_250,NUM_TIME,(string)(auVar7 << 0x20),SUB81(local_1338,0),description_20,
             inner_20,true);
  ::RPCResult::RPCResult(&local_1c8,(RPCResult *)RESULT_LAST_PROCESSED_BLOCK);
  __l_00._M_len = 0x15;
  __l_00._M_array = (iterator)(local_c78 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_14a8,__l_00,(allocator_type *)&stack0xffffffffffffe8a7);
  m_key_name_16._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe86c;
  m_key_name_16._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_16._M_string_length = (size_type)in_RDI;
  m_key_name_16.field_2._M_allocated_capacity = in_stack_ffffffffffffe878;
  m_key_name_16.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_21._M_string_length = in_stack_ffffffffffffe890;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_21.field_2 = in_stack_ffffffffffffe898;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar15;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  ::RPCResult::RPCResult(&local_100,OBJ,m_key_name_16,description_21,inner_21,SUB81(local_120,0));
  result._4_4_ = in_stack_ffffffffffffe86c;
  result.m_type = uVar12;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe878;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe880;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe888;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe890;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffe898;
  result._64_8_ = pRVar14;
  result.m_description._M_dataplus._M_p = (pointer)pRVar15;
  result.m_description._M_string_length = (size_type)pRVar16;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe8c0;
  result.m_description.field_2._8_8_ = pRVar17;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar18;
  result.m_cond._M_string_length = (size_type)pRVar19;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffe8e0;
  result.m_cond.field_2._8_8_ = pRVar20;
  RPCResults::RPCResults(&local_1490,result);
  local_13d8._M_dataplus._M_p = (pointer)&local_13d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13d8,"getwalletinfo","");
  local_13f8._M_dataplus._M_p = (pointer)&local_13f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13f8,"");
  HelpExampleCli(&local_13b8,&local_13d8,&local_13f8);
  local_1438._M_dataplus._M_p = (pointer)&local_1438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1438,"getwalletinfo","");
  local_1458._M_dataplus._M_p = (pointer)&local_1458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1458,"");
  HelpExampleRpc(&local_1418,&local_1438,&local_1458);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8._M_dataplus._M_p != &local_13b8.field_2) {
    uVar10 = local_13b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_1418._M_string_length + local_13b8._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1418._M_dataplus._M_p != &local_1418.field_2) {
      uVar10 = local_1418.field_2._M_allocated_capacity;
    }
    if (local_1418._M_string_length + local_13b8._M_string_length <= (ulong)uVar10) {
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1418,0,0,local_13b8._M_dataplus._M_p,local_13b8._M_string_length);
      goto LAB_00bb891c;
    }
  }
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_13b8,local_1418._M_dataplus._M_p,local_1418._M_string_length);
LAB_00bb891c:
  local_1398 = &local_1388;
  puVar2 = (ulong *)(pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar9) {
    local_1388 = paVar9->_M_allocated_capacity;
    uStack_1380 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_1388 = paVar9->_M_allocated_capacity;
    local_1398 = puVar2;
  }
  local_1370 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
  if (local_1398 == &local_1388) {
    uStack_1360 = uStack_1380;
    local_1378 = &local_1368;
  }
  else {
    local_1378 = local_1398;
  }
  local_1368 = local_1388;
  local_1390 = 0;
  local_1388 = local_1388 & 0xffffffffffffff00;
  pcVar13 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:82:9)>
            ::_M_manager;
  description_22._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:82:9)>
       ::_M_invoke;
  description_22._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:82:9)>
                ::_M_manager;
  description_22.field_2 = in_stack_ffffffffffffe898;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar15;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar14;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe8c0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar18;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe8e0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar19;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar20;
  examples.m_examples.field_2._8_8_ = pRVar21;
  local_1398 = &local_1388;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffe878)),description_22,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar13 != (code *)0x0) {
    (*pcVar13)(&stack0xffffffffffffe878,&stack0xffffffffffffe878,3);
  }
  if (local_1378 != &local_1368) {
    operator_delete(local_1378,local_1368 + 1);
  }
  if (local_1398 != &local_1388) {
    operator_delete(local_1398,local_1388 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1418._M_dataplus._M_p != &local_1418.field_2) {
    operator_delete(local_1418._M_dataplus._M_p,local_1418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1458._M_dataplus._M_p != &local_1458.field_2) {
    operator_delete(local_1458._M_dataplus._M_p,local_1458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1438._M_dataplus._M_p != &local_1438.field_2) {
    operator_delete(local_1438._M_dataplus._M_p,local_1438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8._M_dataplus._M_p != &local_13b8.field_2) {
    operator_delete(local_13b8._M_dataplus._M_p,local_13b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13f8._M_dataplus._M_p != &local_13f8.field_2) {
    operator_delete(local_13f8._M_dataplus._M_p,local_13f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
    operator_delete(local_13d8._M_dataplus._M_p,local_13d8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1490.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14a8);
  lVar11 = 0xb28;
  do {
    if ((long *)(local_c78 + lVar11) != *(long **)((long)local_c88 + lVar11)) {
      operator_delete(*(long **)((long)local_c88 + lVar11),*(long *)(local_c78 + lVar11) + 1);
    }
    if ((long *)((long)local_c98 + lVar11) != *(long **)((long)local_ca8 + lVar11)) {
      operator_delete(*(long **)((long)local_ca8 + lVar11),*(long *)((long)local_c98 + lVar11) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar11));
    if ((long *)((long)local_cd8 + lVar11) != *(long **)((long)local_ce8 + lVar11)) {
      operator_delete(*(long **)((long)local_ce8 + lVar11),*(long *)((long)local_cd8 + lVar11) + 1);
    }
    lVar11 = lVar11 + -0x88;
  } while (lVar11 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8a8);
  if (local_1358[0] != local_1348) {
    operator_delete(local_1358[0],local_1348[0] + 1);
  }
  if (local_1338[0] != local_1328) {
    operator_delete(local_1338[0],local_1328[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8c8);
  if (local_1318[0] != local_1308) {
    operator_delete(local_1318[0],local_1308[0] + 1);
  }
  if (local_12f8[0] != local_12e8) {
    operator_delete(local_12f8[0],local_12e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8e8);
  if (local_12d8[0] != local_12c8) {
    operator_delete(local_12d8[0],local_12c8[0] + 1);
  }
  if (local_12b8[0] != local_12a8) {
    operator_delete(local_12b8[0],local_12a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16f8);
  if (local_1298[0] != local_1288) {
    operator_delete(local_1298[0],local_1288[0] + 1);
  }
  if (local_1278[0] != local_1268) {
    operator_delete(local_1278[0],local_1268[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16a0);
  lVar11 = 0x110;
  do {
    if ((long *)(local_11e8 + lVar11) != *(long **)((long)local_11f8 + lVar11)) {
      operator_delete(*(long **)((long)local_11f8 + lVar11),*(long *)(local_11e8 + lVar11) + 1);
    }
    if ((long *)((long)local_1208 + lVar11) != *(long **)((long)local_1218 + lVar11)) {
      operator_delete(*(long **)((long)local_1218 + lVar11),*(long *)((long)local_1208 + lVar11) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar11));
    if ((long *)((long)local_1248 + lVar11) != *(long **)((long)local_1258 + lVar11)) {
      operator_delete(*(long **)((long)local_1258 + lVar11),*(long *)((long)local_1248 + lVar11) + 1
                     );
    }
    lVar11 = lVar11 + -0x88;
  } while (lVar11 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16d8);
  if (local_1258[0] != local_1248) {
    operator_delete(local_1258[0],local_1248[0] + 1);
  }
  if (local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1238.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1238.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16b8);
  if (local_1218[0] != local_1208) {
    operator_delete(local_1218[0],local_1208[0] + 1);
  }
  if (local_11f8[0] != (pointer)local_11e8) {
    operator_delete(local_11f8[0],local_11e8._0_8_ + 1);
  }
  if (local_10c8[0] != local_10b8) {
    operator_delete(local_10c8[0],local_10b8[0] + 1);
  }
  if (local_10a8[0] != local_1098) {
    operator_delete(local_10a8[0],local_1098[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1688);
  if (local_1088[0] != local_1078) {
    operator_delete(local_1088[0],local_1078[0] + 1);
  }
  if (local_1068[0] != local_1058) {
    operator_delete(local_1068[0],local_1058[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1668);
  if (local_1048[0] != local_1038) {
    operator_delete(local_1048[0],local_1038[0] + 1);
  }
  if (local_1028[0] != local_1018) {
    operator_delete(local_1028[0],local_1018[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1648);
  if (local_1008[0] != local_ff8) {
    operator_delete(local_1008[0],local_ff8[0] + 1);
  }
  if (local_fe8[0] != local_fd8) {
    operator_delete(local_fe8[0],local_fd8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1628);
  if (local_fa8 != &local_f98) {
    operator_delete(local_fa8,local_f98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
    operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
  }
  if (local_f88[0] != local_f78) {
    operator_delete(local_f88[0],local_f78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1608);
  if (local_f48 != &local_f38) {
    operator_delete(local_f48,local_f38 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
    operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
  }
  if (local_f28[0] != local_f18) {
    operator_delete(local_f28[0],local_f18[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15e8);
  if (local_f08[0] != local_ef8) {
    operator_delete(local_f08[0],local_ef8[0] + 1);
  }
  if (local_ee8[0] != local_ed8) {
    operator_delete(local_ee8[0],local_ed8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15c8);
  if (local_ec8[0] != local_eb8) {
    operator_delete(local_ec8[0],local_eb8[0] + 1);
  }
  if (local_ea8[0] != local_e98) {
    operator_delete(local_ea8[0],local_e98[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15a8);
  if (local_e68 != &local_e58) {
    operator_delete(local_e68,local_e58 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e88._M_dataplus._M_p != &local_e88.field_2) {
    operator_delete(local_e88._M_dataplus._M_p,local_e88.field_2._M_allocated_capacity + 1);
  }
  if (local_e48[0] != local_e38) {
    operator_delete(local_e48[0],local_e38[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1588);
  if (local_e28[0] != local_e18) {
    operator_delete(local_e28[0],local_e18[0] + 1);
  }
  if (local_e08[0] != local_df8) {
    operator_delete(local_e08[0],local_df8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1568);
  if (local_de8[0] != local_dd8) {
    operator_delete(local_de8[0],local_dd8[0] + 1);
  }
  if (local_dc8[0] != local_db8) {
    operator_delete(local_dc8[0],local_db8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1548);
  if (local_da8[0] != local_d98) {
    operator_delete(local_da8[0],local_d98[0] + 1);
  }
  if (local_d88[0] != local_d78) {
    operator_delete(local_d88[0],local_d78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1528);
  if (local_d68[0] != local_d58) {
    operator_delete(local_d68[0],local_d58[0] + 1);
  }
  if (local_d48[0] != local_d38) {
    operator_delete(local_d48[0],local_d38[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1508);
  if (local_d28[0] != local_d18) {
    operator_delete(local_d28[0],local_d18[0] + 1);
  }
  if (local_d08[0] != local_cf8) {
    operator_delete(local_d08[0],local_cf8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14e8);
  if (local_ce8[0] != local_cd8) {
    operator_delete(local_ce8[0],local_cd8[0] + 1);
  }
  if (local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_cc8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14c8);
  if (local_ca8[0] != local_c98) {
    operator_delete(local_ca8[0],local_c98[0] + 1);
  }
  if (local_c88[0] != (pointer)local_c78) {
    operator_delete(local_c88[0],local_c78._0_8_ + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1478);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getwalletinfo()
{
    return RPCHelpMan{"getwalletinfo",
                "Returns an object containing various wallet state info.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {
                        {RPCResult::Type::STR, "walletname", "the wallet name"},
                        {RPCResult::Type::NUM, "walletversion", "the wallet version"},
                        {RPCResult::Type::STR, "format", "the database format (bdb or sqlite)"},
                        {RPCResult::Type::STR_AMOUNT, "balance", "DEPRECATED. Identical to getbalances().mine.trusted"},
                        {RPCResult::Type::STR_AMOUNT, "unconfirmed_balance", "DEPRECATED. Identical to getbalances().mine.untrusted_pending"},
                        {RPCResult::Type::STR_AMOUNT, "immature_balance", "DEPRECATED. Identical to getbalances().mine.immature"},
                        {RPCResult::Type::NUM, "txcount", "the total number of transactions in the wallet"},
                        {RPCResult::Type::NUM_TIME, "keypoololdest", /*optional=*/true, "the " + UNIX_EPOCH_TIME + " of the oldest pre-generated key in the key pool. Legacy wallets only."},
                        {RPCResult::Type::NUM, "keypoolsize", "how many new keys are pre-generated (only counts external keys)"},
                        {RPCResult::Type::NUM, "keypoolsize_hd_internal", /*optional=*/true, "how many new keys are pre-generated for internal use (used for change outputs, only appears if the wallet is using this feature, otherwise external keys are used)"},
                        {RPCResult::Type::NUM_TIME, "unlocked_until", /*optional=*/true, "the " + UNIX_EPOCH_TIME + " until which the wallet is unlocked for transfers, or 0 if the wallet is locked (only present for passphrase-encrypted wallets)"},
                        {RPCResult::Type::STR_AMOUNT, "paytxfee", "the transaction fee configuration, set in " + CURRENCY_UNIT + "/kvB"},
                        {RPCResult::Type::STR_HEX, "hdseedid", /*optional=*/true, "the Hash160 of the HD seed (only present when HD is enabled)"},
                        {RPCResult::Type::BOOL, "private_keys_enabled", "false if privatekeys are disabled for this wallet (enforced watch-only wallet)"},
                        {RPCResult::Type::BOOL, "avoid_reuse", "whether this wallet tracks clean/dirty coins in terms of reuse"},
                        {RPCResult::Type::OBJ, "scanning", "current scanning details, or false if no scan is in progress",
                        {
                            {RPCResult::Type::NUM, "duration", "elapsed seconds since scan start"},
                            {RPCResult::Type::NUM, "progress", "scanning progress percentage [0.0, 1.0]"},
                        }, /*skip_type_check=*/true},
                        {RPCResult::Type::BOOL, "descriptors", "whether this wallet uses descriptors for output script management"},
                        {RPCResult::Type::BOOL, "external_signer", "whether this wallet is configured to use an external signer such as a hardware wallet"},
                        {RPCResult::Type::BOOL, "blank", "Whether this wallet intentionally does not contain any keys, scripts, or descriptors"},
                        {RPCResult::Type::NUM_TIME, "birthtime", /*optional=*/true, "The start time for blocks scanning. It could be modified by (re)importing any descriptor with an earlier timestamp."},
                        RESULT_LAST_PROCESSED_BLOCK,
                    }},
                },
                RPCExamples{
                    HelpExampleCli("getwalletinfo", "")
            + HelpExampleRpc("getwalletinfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    UniValue obj(UniValue::VOBJ);

    size_t kpExternalSize = pwallet->KeypoolCountExternalKeys();
    const auto bal = GetBalance(*pwallet);
    obj.pushKV("walletname", pwallet->GetName());
    obj.pushKV("walletversion", pwallet->GetVersion());
    obj.pushKV("format", pwallet->GetDatabase().Format());
    obj.pushKV("balance", ValueFromAmount(bal.m_mine_trusted));
    obj.pushKV("unconfirmed_balance", ValueFromAmount(bal.m_mine_untrusted_pending));
    obj.pushKV("immature_balance", ValueFromAmount(bal.m_mine_immature));
    obj.pushKV("txcount",       (int)pwallet->mapWallet.size());
    const auto kp_oldest = pwallet->GetOldestKeyPoolTime();
    if (kp_oldest.has_value()) {
        obj.pushKV("keypoololdest", kp_oldest.value());
    }
    obj.pushKV("keypoolsize", (int64_t)kpExternalSize);

    LegacyScriptPubKeyMan* spk_man = pwallet->GetLegacyScriptPubKeyMan();
    if (spk_man) {
        CKeyID seed_id = spk_man->GetHDChain().seed_id;
        if (!seed_id.IsNull()) {
            obj.pushKV("hdseedid", seed_id.GetHex());
        }
    }

    if (pwallet->CanSupportFeature(FEATURE_HD_SPLIT)) {
        obj.pushKV("keypoolsize_hd_internal",   (int64_t)(pwallet->GetKeyPoolSize() - kpExternalSize));
    }
    if (pwallet->IsCrypted()) {
        obj.pushKV("unlocked_until", pwallet->nRelockTime);
    }
    obj.pushKV("paytxfee", ValueFromAmount(pwallet->m_pay_tx_fee.GetFeePerK()));
    obj.pushKV("private_keys_enabled", !pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    obj.pushKV("avoid_reuse", pwallet->IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE));
    if (pwallet->IsScanning()) {
        UniValue scanning(UniValue::VOBJ);
        scanning.pushKV("duration", Ticks<std::chrono::seconds>(pwallet->ScanningDuration()));
        scanning.pushKV("progress", pwallet->ScanningProgress());
        obj.pushKV("scanning", std::move(scanning));
    } else {
        obj.pushKV("scanning", false);
    }
    obj.pushKV("descriptors", pwallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));
    obj.pushKV("external_signer", pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER));
    obj.pushKV("blank", pwallet->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET));
    if (int64_t birthtime = pwallet->GetBirthTime(); birthtime != UNKNOWN_TIME) {
        obj.pushKV("birthtime", birthtime);
    }

    AppendLastProcessedBlock(obj, *pwallet);
    return obj;
},
    };
}